

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.c
# Opt level: O0

void golf_game_init(void)

{
  golf_graphics_t *pgVar1;
  golf_graphics_t *pgVar2;
  vec3 vVar3;
  vec4 vVar4;
  undefined8 local_14c;
  vec4 color;
  int i;
  
  memset(&game,0,0xa28);
  golf_data_load("data/config/game.cfg",false);
  golf = golf_get();
  graphics = golf_graphics_get();
  inputs = golf_inputs_get();
  game_cfg = golf_data_get_config("data/config/game.cfg");
  game.state = GOLF_GAME_STATE_MAIN_MENU;
  game.cam.auto_rotate = true;
  game.cam.angle = 0.0;
  game.cam.angle_velocity = 0.0;
  vVar3 = vec3_create(0.0,0.0,0.0);
  game.ball.pos.z = vVar3.z;
  game.ball.pos._0_8_ = vVar3._0_8_;
  vVar3 = vec3_create(0.0,0.0,0.0);
  game.ball.draw_pos.z = vVar3.z;
  game.ball.draw_pos._0_8_ = vVar3._0_8_;
  vVar3 = vec3_create(0.0,0.0,0.0);
  game.ball.vel.z = vVar3.z;
  game.ball.vel._0_8_ = vVar3._0_8_;
  vVar3 = vec3_create(0.0,0.0,0.0);
  game.ball.rot_vec.z = vVar3.z;
  game.ball.rot_vec._0_8_ = vVar3._0_8_;
  game.ball.orientation = quat_create(0.0,0.0,0.0,1.0);
  game.ball.radius = 0.12;
  game.ball.time_going_slow = 0.0;
  game.ball.time_since_water_ripple = 0.0;
  game.ball.rot_vel = 0.0;
  game.ball.is_moving = false;
  game.ball.is_out_of_bounds = false;
  game.ball.is_in_hole = false;
  game.ball.time_since_impact_sound = 0.0;
  game.ball.time_out_of_water = 1.0;
  game.physics.time_behind = 0.0;
  game.physics.debug_draw_collisions = false;
  game.physics.collision_history.data = (golf_collision_data_t *)0x0;
  game.physics.collision_history.length = 0;
  game.physics.collision_history.capacity = 0;
  game.physics.collision_history.alloc_category = "physics";
  golf_bvh_init(&game.physics.static_bvh);
  golf_bvh_init(&game.physics.dynamic_bvh);
  game.aim_line.power = 0.0;
  game.aim_line.aim_delta = vec2_create(0.0,0.0);
  game.aim_line.offset = vec2_create(0.0,0.0);
  pgVar1 = graphics;
  game.aim_line.num_points = 0;
  vVar3 = vec3_create(5.0,5.0,5.0);
  (pgVar1->cam_pos).z = vVar3.z;
  (pgVar1->cam_pos).x = (float)(int)vVar3._0_8_;
  pgVar2 = graphics;
  (pgVar1->cam_pos).y = (float)(int)((ulong)vVar3._0_8_ >> 0x20);
  vVar3 = vec3_create(-5.0,-5.0,-5.0);
  vVar3 = vec3_normalize(vVar3);
  (pgVar2->cam_dir).z = vVar3.z;
  (pgVar2->cam_dir).x = (float)(int)vVar3._0_8_;
  pgVar1 = graphics;
  (pgVar2->cam_dir).y = (float)(int)((ulong)vVar3._0_8_ >> 0x20);
  vVar3 = vec3_create(0.0,1.0,0.0);
  (pgVar1->cam_up).x = (float)(int)vVar3._0_8_;
  (pgVar1->cam_up).y = (float)(int)((ulong)vVar3._0_8_ >> 0x20);
  (pgVar1->cam_up).z = vVar3.z;
  for (color.z = 0.0; (int)color.z < 0x40; color.z = (float)((int)color.z + 1)) {
    game.water_ripples[(int)color.z].t0 = 3.4028235e+38;
    vVar4 = vec4_create(0.0,0.0,0.0,0.0);
    color._0_8_ = vVar4._8_8_;
    local_14c = vVar4._0_8_;
    if ((int)color.z % 4 == 0) {
      vVar4 = golf_config_get_vec4(game_cfg,"water_ripple_color_0");
      color._0_8_ = vVar4._8_8_;
      local_14c = vVar4._0_8_;
    }
    else if ((int)color.z % 4 == 1) {
      vVar4 = golf_config_get_vec4(game_cfg,"water_ripple_color_1");
      color._0_8_ = vVar4._8_8_;
      local_14c = vVar4._0_8_;
    }
    else if ((int)color.z % 4 == 2) {
      vVar4 = golf_config_get_vec4(game_cfg,"water_ripple_color_2");
      color._0_8_ = vVar4._8_8_;
      local_14c = vVar4._0_8_;
    }
    else if ((int)color.z % 4 == 3) {
      vVar4 = golf_config_get_vec4(game_cfg,"water_ripple_color_3");
      color._0_8_ = vVar4._8_8_;
      local_14c = vVar4._0_8_;
    }
    game.water_ripples[(int)color.z].color.x = (float)(undefined4)local_14c;
    game.water_ripples[(int)color.z].color.y = (float)local_14c._4_4_;
    game.water_ripples[(int)color.z].color.z = color.x;
    game.water_ripples[(int)color.z].color.w = color.y;
  }
  game.t = 0.0;
  golf_debug_console_add_tab("Game",_golf_game_debug_tab);
  return;
}

Assistant:

void golf_game_init(void) {
    memset(&game, 0, sizeof(game));

    golf_data_load("data/config/game.cfg", false);

    golf = golf_get();
    graphics = golf_graphics_get();
    inputs = golf_inputs_get();
    game_cfg = golf_data_get_config("data/config/game.cfg");

    game.state = GOLF_GAME_STATE_MAIN_MENU;
    game.cam.auto_rotate = true;
    game.cam.angle = 0;
    game.cam.angle_velocity = 0;

    game.ball.pos = V3(0, 0, 0);
    game.ball.draw_pos = V3(0, 0, 0);
    game.ball.vel = V3(0, 0, 0);
    game.ball.rot_vec = V3(0, 0, 0);
    game.ball.orientation = QUAT(0, 0, 0, 1);
    game.ball.radius = 0.12f;
    game.ball.time_going_slow = 0;
    game.ball.time_since_water_ripple = 0;
    game.ball.rot_vel = 0;
    game.ball.is_moving = false;
    game.ball.is_out_of_bounds = false;
    game.ball.is_in_hole = false;
    game.ball.time_since_impact_sound = 0;
    game.ball.time_out_of_water = 1;

    game.physics.time_behind = 0;
    game.physics.debug_draw_collisions = false;
    vec_init(&game.physics.collision_history, "physics");

    golf_bvh_init(&game.physics.static_bvh);
    golf_bvh_init(&game.physics.dynamic_bvh);

    game.aim_line.power = 0;
    game.aim_line.aim_delta = V2(0, 0);
    game.aim_line.offset = V2(0, 0);
    game.aim_line.num_points = 0;

    graphics->cam_pos = V3(5, 5, 5);
    graphics->cam_dir = vec3_normalize(V3(-5, -5, -5));
    graphics->cam_up = V3(0, 1, 0);

    for (int i = 0; i < MAX_NUM_WATER_RIPPLES; i++) {
        game.water_ripples[i].t0 = FLT_MAX;

        vec4 color = V4(0, 0, 0, 0);
        if (i % 4 == 0) {
            color = CFG_VEC4(game_cfg, "water_ripple_color_0");
        }
        else if (i % 4 == 1) {
            color = CFG_VEC4(game_cfg, "water_ripple_color_1");
        }
        else if (i % 4 == 2) {
            color = CFG_VEC4(game_cfg, "water_ripple_color_2");
        }
        else if (i % 4 == 3) {
            color = CFG_VEC4(game_cfg, "water_ripple_color_3");
        }
        game.water_ripples[i].color = color;
    }

    game.t = 0;

    golf_debug_console_add_tab("Game", _golf_game_debug_tab);
}